

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu_factory.cpp
# Opt level: O0

unique_ptr<n_e_s::core::IMmu,_std::default_delete<n_e_s::core::IMmu>_>
n_e_s::core::MmuFactory::create_empty(void)

{
  __uniq_ptr_data<n_e_s::core::IMmu,_std::default_delete<n_e_s::core::IMmu>,_true,_true> in_RDI;
  unique_ptr<n_e_s::core::Mmu,_std::default_delete<n_e_s::core::Mmu>_> local_18 [2];
  
  std::make_unique<n_e_s::core::Mmu>();
  std::unique_ptr<n_e_s::core::IMmu,std::default_delete<n_e_s::core::IMmu>>::
  unique_ptr<n_e_s::core::Mmu,std::default_delete<n_e_s::core::Mmu>,void>
            ((unique_ptr<n_e_s::core::IMmu,std::default_delete<n_e_s::core::IMmu>> *)
             in_RDI.
             super___uniq_ptr_impl<n_e_s::core::IMmu,_std::default_delete<n_e_s::core::IMmu>_>._M_t.
             super__Tuple_impl<0UL,_n_e_s::core::IMmu_*,_std::default_delete<n_e_s::core::IMmu>_>.
             super__Head_base<0UL,_n_e_s::core::IMmu_*,_false>._M_head_impl,local_18);
  std::unique_ptr<n_e_s::core::Mmu,_std::default_delete<n_e_s::core::Mmu>_>::~unique_ptr(local_18);
  return (__uniq_ptr_data<n_e_s::core::IMmu,_std::default_delete<n_e_s::core::IMmu>,_true,_true>)
         (tuple<n_e_s::core::IMmu_*,_std::default_delete<n_e_s::core::IMmu>_>)
         in_RDI.super___uniq_ptr_impl<n_e_s::core::IMmu,_std::default_delete<n_e_s::core::IMmu>_>.
         _M_t.super__Tuple_impl<0UL,_n_e_s::core::IMmu_*,_std::default_delete<n_e_s::core::IMmu>_>.
         super__Head_base<0UL,_n_e_s::core::IMmu_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<IMmu> MmuFactory::create_empty() {
    return std::make_unique<Mmu>();
}